

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.cpp
# Opt level: O1

void __thiscall
CRegexParser::optimize_transition(CRegexParser *this,re_machine *machine,re_state_id *trans)

{
  re_tuple *prVar1;
  int iVar2;
  
  iVar2 = *trans;
  while( true ) {
    if ((iVar2 == -1) || (iVar2 == machine->final)) {
      return;
    }
    prVar1 = this->tuple_arr_;
    if (prVar1[iVar2].typ != RE_EPSILON) {
      return;
    }
    if (prVar1[iVar2].next_state_2 != -1) break;
    iVar2 = prVar1[iVar2].next_state_1;
    *trans = iVar2;
  }
  return;
}

Assistant:

void CRegexParser::optimize_transition(const re_machine *machine,
                                       re_state_id *trans)
{
    /* keep going as long as we find meaningless forwarding branches */
    for (;;)
    {
        re_tuple *tuple_nxt;
        
        /* 
         *   if this transition points to the machine's final state, there's
         *   nowhere else to go from here 
         */
        if (*trans == RE_STATE_INVALID || *trans == machine->final)
            return;

        /* get the state the '*trans' is currently pointing to */
        tuple_nxt = &tuple_arr_[*trans];

        /* 
         *   if the transition points to anything other than a single-branch
         *   epsilon, we point to a meaningful next state, so there's no
         *   further branch-to-branch elimination we can perform 
         */
        if (tuple_nxt->typ != RE_EPSILON
            || tuple_nxt->next_state_2 != RE_STATE_INVALID)
            return;

        /* 
         *   This transition points to a meaningless intermediate state, so
         *   we can simply skip the intermediate state and go directly from
         *   the current state to the target state's single target.  Once
         *   we've done this, continue scanning, because we might find that
         *   the new target state itself is a meaningless intermediate state
         *   that we can skip past as well (and so on, and so on - keep
         *   going until we find a real target state).  
         */
        *trans = tuple_nxt->next_state_1;
    }
}